

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_HTMLparser(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  char *pcVar29;
  htmlParserCtxtPtr pxVar30;
  char *pcVar31;
  htmlDocPtr pxVar32;
  xmlParserCtxtPtr pxVar33;
  xmlChar *pxVar34;
  undefined8 uVar35;
  int *piVar36;
  int nr;
  int nr_00;
  int n_doc;
  uint uVar37;
  uint no;
  ulong uVar38;
  undefined8 *puVar39;
  undefined8 uVar40;
  undefined4 *puVar41;
  int test_ret;
  int iVar42;
  int iVar43;
  int *in_RSI;
  htmlDocPtr pxVar44;
  int test_ret_5;
  int test_ret_7;
  undefined4 uVar45;
  int n_filename;
  uint uVar46;
  int local_8c;
  int test_ret_2;
  int local_7c;
  int test_ret_4;
  int test_ret_1;
  int test_ret_12;
  int local_50;
  int local_4c;
  int test_ret_11;
  
  if (quiet == '\0') {
    puts("Testing HTMLparser : 37 of 43 functions ...");
  }
  bVar1 = true;
  iVar42 = 0;
  while (bVar1) {
    uVar38 = 0;
    while (iVar43 = (int)uVar38, iVar43 != 2) {
      pxVar44 = (htmlDocPtr)0x0;
      if (iVar43 == 0) {
        pxVar44 = (htmlDocPtr)(inttab + 1);
      }
      bVar1 = true;
      while (bVar1) {
        pxVar32 = (htmlDocPtr)0x0;
        while (iVar4 = (int)pxVar32, iVar4 != 2) {
          iVar2 = xmlMemBlocks();
          uVar35 = 0;
          if (iVar4 == 0) {
            uVar35 = 0x15e43c;
          }
          in_RSI = (int *)pxVar44;
          UTF8ToHtml(0,pxVar44,0,uVar35);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in UTF8ToHtml",(ulong)(uint)(iVar3 - iVar2));
            iVar42 = iVar42 + 1;
            printf(" %d",0);
            printf(" %d",uVar38);
            printf(" %d",0);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar32;
          }
          pxVar32 = (htmlDocPtr)(ulong)(iVar4 + 1);
        }
        bVar1 = false;
      }
      uVar38 = (ulong)(iVar43 + 1);
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  pxVar44 = (htmlDocPtr)0x1;
  local_7c = 0;
  while (pxVar44 != (htmlDocPtr)0x0) {
    uVar38 = 0;
    while( true ) {
      pxVar44 = (htmlDocPtr)0x0;
      iVar43 = (int)uVar38;
      if (iVar43 == 5) break;
      while( true ) {
        iVar4 = (int)in_RSI;
        iVar2 = (int)pxVar44;
        if (iVar2 == 4) break;
        iVar3 = xmlMemBlocks();
        in_RSI = (int *)gen_const_xmlChar_ptr(iVar43,iVar4);
        iVar4 = gen_int(iVar2,iVar4);
        htmlAttrAllowed(0,in_RSI,iVar4);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlAttrAllowed",(ulong)(uint)(iVar4 - iVar3));
          local_7c = local_7c + 1;
          printf(" %d",0);
          printf(" %d",uVar38);
          printf(" %d");
          putchar(10);
          in_RSI = (int *)pxVar44;
        }
        pxVar44 = (htmlDocPtr)(ulong)(iVar2 + 1);
      }
      uVar38 = (ulong)(iVar43 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar43 = 0;
  uVar38 = 0;
  while (iVar4 = (int)uVar38, iVar4 != 3) {
    for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
      bVar1 = true;
      while (iVar3 = (int)in_RSI, bVar1) {
        iVar5 = xmlMemBlocks();
        pxVar44 = gen_htmlDocPtr(iVar4,iVar3);
        in_RSI = (int *)gen_const_xmlChar_ptr(iVar2,iVar3);
        htmlAutoCloseTag(pxVar44,in_RSI,0);
        call_tests = call_tests + 1;
        des_htmlDocPtr((int)pxVar44,(htmlDocPtr)in_RSI,nr);
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar5 == iVar3) break;
        iVar3 = xmlMemBlocks();
        bVar1 = false;
        printf("Leak of %d blocks found in htmlAutoCloseTag",(ulong)(uint)(iVar3 - iVar5));
        iVar43 = iVar43 + 1;
        printf(" %d",uVar38);
        printf(" %d");
        in_RSI = (int *)0x0;
        printf(" %d");
        putchar(10);
      }
    }
    uVar38 = (ulong)(iVar4 + 1);
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  for (uVar46 = 0; uVar46 != 6; uVar46 = uVar46 + 1) {
    pxVar44 = (htmlDocPtr)0x0;
    puVar39 = &DAT_0015bd68;
    while( true ) {
      iVar2 = (int)in_RSI;
      uVar7 = (uint)pxVar44;
      if (uVar7 == 4) break;
      iVar3 = xmlMemBlocks();
      pcVar29 = gen_fileoutput(uVar46,iVar2);
      if (uVar7 < 3) {
        in_RSI = (int *)*puVar39;
      }
      else {
        in_RSI = (int *)0x0;
      }
      pxVar30 = (htmlParserCtxtPtr)htmlCreateFileParserCtxt(pcVar29);
      desret_htmlParserCtxtPtr(pxVar30);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar3 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateFileParserCtxt",(ulong)(uint)(iVar2 - iVar3));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar46);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar44;
      }
      pxVar44 = (htmlDocPtr)(ulong)(uVar7 + 1);
      puVar39 = puVar39 + 1;
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar46 = 0; uVar46 != 4; uVar46 = uVar46 + 1) {
    pxVar44 = (htmlDocPtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar5 = (int)pxVar44;
      if (iVar5 == 4) break;
      iVar6 = xmlMemBlocks();
      if (uVar46 == 0) {
        bVar1 = false;
        pcVar29 = "foo";
      }
      else if (uVar46 == 2) {
        bVar1 = false;
        pcVar29 = "test/ent2";
      }
      else if (uVar46 == 1) {
        bVar1 = false;
        pcVar29 = "<foo/>";
      }
      else {
        bVar1 = true;
        pcVar29 = (char *)0x0;
      }
      uVar7 = gen_int(iVar5,iVar3);
      in_RSI = (int *)(ulong)uVar7;
      if (!bVar1) {
        iVar3 = xmlStrlen(pcVar29);
        in_RSI = (int *)(ulong)uVar7;
        if (iVar3 < (int)uVar7) {
          in_RSI = (int *)0x0;
        }
      }
      pxVar30 = (htmlParserCtxtPtr)htmlCreateMemoryParserCtxt(pcVar29);
      desret_htmlParserCtxtPtr(pxVar30);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar6 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",(ulong)(uint)(iVar3 - iVar6))
        ;
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar46);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar44;
      }
      pxVar44 = (htmlDocPtr)(ulong)(iVar5 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar46 = 1;
  iVar3 = 0;
  while (uVar46 != 0) {
    for (uVar7 = 0; uVar46 = 0, uVar7 != 3; uVar7 = uVar7 + 1) {
      for (; uVar46 != 4; uVar46 = uVar46 + 1) {
        for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
          for (uVar8 = 0; uVar8 != 6; uVar8 = uVar8 + 1) {
            _test_ret_4 = &DAT_0014b0b0;
            for (uVar37 = 0; iVar6 = (int)in_RSI, uVar37 != 4; uVar37 = uVar37 + 1) {
              iVar9 = xmlMemBlocks();
              in_RSI = &call_tests;
              if (uVar7 != 0) {
                if (uVar7 == 1) {
                  in_RSI = (int *)0xffffffffffffffff;
                }
                else {
                  in_RSI = (int *)0x0;
                }
              }
              if (uVar46 == 0) {
                bVar1 = false;
                pcVar29 = "foo";
              }
              else if (uVar46 == 2) {
                bVar1 = false;
                pcVar29 = "test/ent2";
              }
              else if (uVar46 == 1) {
                bVar1 = false;
                pcVar29 = "<foo/>";
              }
              else {
                bVar1 = true;
                pcVar29 = (char *)0x0;
              }
              iVar10 = gen_int(iVar5,iVar6);
              pcVar31 = gen_fileoutput(uVar8,iVar6);
              uVar45 = 0xffffffff;
              if (uVar37 < 3) {
                uVar45 = *_test_ret_4;
              }
              if ((!bVar1) && (iVar6 = xmlStrlen(pcVar29), iVar6 < iVar10)) {
                iVar10 = 0;
              }
              pxVar30 = (htmlParserCtxtPtr)
                        htmlCreatePushParserCtxt(0,in_RSI,pcVar29,iVar10,pcVar31,uVar45);
              desret_htmlParserCtxtPtr(pxVar30);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar9 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                       (ulong)(uint)(iVar6 - iVar9));
                iVar3 = iVar3 + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar7);
                printf(" %d",(ulong)uVar46);
                printf(" %d",iVar5);
                printf(" %d",(ulong)uVar8);
                in_RSI = (int *)(ulong)uVar37;
                printf(" %d");
                putchar(10);
              }
              _test_ret_4 = _test_ret_4 + 1;
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
    bVar1 = true;
    while (iVar6 = (int)in_RSI, bVar1) {
      iVar9 = xmlMemBlocks();
      pxVar30 = gen_htmlParserCtxtPtr(iVar5,iVar6);
      in_RSI = (int *)0x0;
      pxVar44 = (htmlDocPtr)htmlCtxtParseDocument(pxVar30);
      desret_htmlDocPtr(pxVar44);
      call_tests = call_tests + 1;
      if (pxVar30 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar9 == iVar6) break;
      iVar6 = xmlMemBlocks();
      bVar1 = false;
      printf("Leak of %d blocks found in htmlCtxtParseDocument",(ulong)(uint)(iVar6 - iVar9));
      test_ret_1 = test_ret_1 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_50 = 0;
  for (uVar46 = 0; uVar46 != 3; uVar46 = uVar46 + 1) {
    for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
      uVar38 = 0;
      while (uVar7 = (uint)uVar38, uVar7 != 4) {
        for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
          pxVar44 = (htmlDocPtr)0x0;
          while( true ) {
            iVar9 = (int)in_RSI;
            iVar6 = (int)pxVar44;
            if (iVar6 == 4) break;
            iVar10 = xmlMemBlocks();
            pxVar30 = gen_htmlParserCtxtPtr(uVar46,iVar9);
            in_RSI = (int *)gen_const_xmlChar_ptr(iVar5,iVar9);
            if (uVar7 < 3) {
              uVar35 = (&DAT_0015bd68)[uVar38];
            }
            else {
              uVar35 = 0;
            }
            if (uVar8 < 3) {
              uVar40 = (&DAT_0015bd68)[uVar8];
            }
            else {
              uVar40 = 0;
            }
            iVar9 = gen_int(iVar6,iVar9);
            pxVar32 = (htmlDocPtr)htmlCtxtReadDoc(pxVar30,in_RSI,uVar35,uVar40,iVar9);
            desret_htmlDocPtr(pxVar32);
            call_tests = call_tests + 1;
            if (pxVar30 != (htmlParserCtxtPtr)0x0) {
              htmlFreeParserCtxt();
            }
            xmlResetLastError();
            iVar9 = xmlMemBlocks();
            if (iVar10 != iVar9) {
              iVar9 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCtxtReadDoc",(ulong)(uint)(iVar9 - iVar10));
              local_50 = local_50 + 1;
              printf(" %d",(ulong)uVar46);
              printf(" %d",iVar5);
              printf(" %d",uVar38);
              printf(" %d",uVar8);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar44;
            }
            pxVar44 = (htmlDocPtr)(ulong)(iVar6 + 1);
          }
        }
        uVar38 = (ulong)(uVar7 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
    for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 1) {
      uVar38 = 0;
      while (uVar46 = (uint)uVar38, uVar46 != 4) {
        for (iVar9 = 0; iVar10 = (int)in_RSI, iVar9 != 4; iVar9 = iVar9 + 1) {
          pxVar30 = gen_htmlParserCtxtPtr(iVar5,iVar10);
          in_RSI = (int *)gen_filepath(iVar6,iVar10);
          if (uVar46 < 3) {
            uVar35 = (&DAT_0015bd68)[uVar38];
          }
          else {
            uVar35 = 0;
          }
          iVar10 = gen_int(iVar9,iVar10);
          pxVar44 = (htmlDocPtr)htmlCtxtReadFile(pxVar30,in_RSI,uVar35,iVar10);
          desret_htmlDocPtr(pxVar44);
          call_tests = call_tests + 1;
          if (pxVar30 != (htmlParserCtxtPtr)0x0) {
            htmlFreeParserCtxt(pxVar30);
          }
          xmlResetLastError();
        }
        uVar38 = (ulong)(uVar46 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_4c = 0;
  for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
    pcVar29 = (char *)in_RSI;
    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
      for (iVar9 = 0; iVar9 != 4; iVar9 = iVar9 + 1) {
        uVar38 = 0;
        while (uVar46 = (uint)uVar38, uVar46 != 4) {
          for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
            for (uVar8 = 0; iVar10 = (int)pcVar29, uVar8 != 4; uVar8 = uVar8 + 1) {
              iVar11 = xmlMemBlocks();
              pxVar30 = gen_htmlParserCtxtPtr(iVar5,iVar10);
              if (iVar6 == 0) {
                bVar1 = false;
                pcVar29 = "foo";
              }
              else if (iVar6 == 2) {
                bVar1 = false;
                pcVar29 = "test/ent2";
              }
              else if (iVar6 == 1) {
                bVar1 = false;
                pcVar29 = "<foo/>";
              }
              else {
                bVar1 = true;
                pcVar29 = (char *)0x0;
              }
              iVar12 = gen_int(iVar9,iVar10);
              if (uVar46 < 3) {
                uVar35 = (&DAT_0015bd68)[uVar38];
              }
              else {
                uVar35 = 0;
              }
              if (uVar7 < 3) {
                uVar40 = (&DAT_0015bd68)[uVar7];
              }
              else {
                uVar40 = 0;
              }
              iVar10 = gen_int(uVar8,iVar10);
              if ((!bVar1) && (iVar13 = xmlStrlen(pcVar29), iVar13 < iVar12)) {
                iVar12 = 0;
              }
              pxVar44 = (htmlDocPtr)htmlCtxtReadMemory(pxVar30,pcVar29,iVar12,uVar35,uVar40,iVar10);
              desret_htmlDocPtr(pxVar44);
              call_tests = call_tests + 1;
              if (pxVar30 != (htmlParserCtxtPtr)0x0) {
                htmlFreeParserCtxt();
              }
              xmlResetLastError();
              iVar10 = xmlMemBlocks();
              if (iVar11 != iVar10) {
                iVar10 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCtxtReadMemory",
                       (ulong)(uint)(iVar10 - iVar11));
                local_4c = local_4c + 1;
                printf(" %d",iVar5);
                printf(" %d",iVar6);
                printf(" %d",iVar9);
                printf(" %d",uVar38);
                printf(" %d",uVar7);
                pcVar29 = (char *)(ulong)uVar8;
                printf(" %d");
                putchar(10);
              }
            }
          }
          uVar38 = (ulong)(uVar46 + 1);
        }
      }
    }
    in_RSI = (int *)pcVar29;
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar46 = 0; uVar46 != 3; uVar46 = uVar46 + 1) {
    iVar6 = xmlMemBlocks();
    pxVar30 = gen_htmlParserCtxtPtr(uVar46,(int)in_RSI);
    htmlCtxtReset();
    call_tests = call_tests + 1;
    if (pxVar30 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar6 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtReset",(ulong)(uint)(iVar9 - iVar6));
      iVar5 = iVar5 + 1;
      in_RSI = (int *)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  for (uVar46 = 0; uVar46 != 3; uVar46 = uVar46 + 1) {
    pxVar44 = (htmlDocPtr)0x0;
    while( true ) {
      iVar9 = (int)in_RSI;
      iVar10 = (int)pxVar44;
      if (iVar10 == 4) break;
      iVar11 = xmlMemBlocks();
      pxVar33 = gen_xmlParserCtxtPtr(uVar46,iVar9);
      uVar7 = gen_int(iVar10,iVar9);
      in_RSI = (int *)(ulong)uVar7;
      htmlCtxtSetOptions();
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar11 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtSetOptions",(ulong)(uint)(iVar9 - iVar11));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar46);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar44;
      }
      pxVar44 = (htmlDocPtr)(ulong)(iVar10 + 1);
    }
  }
  iVar42 = local_7c + iVar42 + iVar43 + iVar4 + iVar2 + iVar3 + test_ret_1 + local_50 + local_4c;
  function_tests = function_tests + 1;
  iVar43 = 0;
  uVar38 = 0;
  while (iVar4 = (int)uVar38, iVar4 != 3) {
    pxVar44 = (htmlDocPtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar3 = (int)pxVar44;
      if (iVar3 == 4) break;
      iVar9 = xmlMemBlocks();
      pxVar30 = gen_htmlParserCtxtPtr(iVar4,iVar2);
      uVar46 = gen_int(iVar3,iVar2);
      in_RSI = (int *)(ulong)uVar46;
      htmlCtxtUseOptions();
      call_tests = call_tests + 1;
      if (pxVar30 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar9 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtUseOptions",(ulong)(uint)(iVar2 - iVar9));
        iVar43 = iVar43 + 1;
        printf(" %d",uVar38);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar44;
      }
      pxVar44 = (htmlDocPtr)(ulong)(iVar3 + 1);
    }
    uVar38 = (ulong)(iVar4 + 1);
  }
  function_tests = function_tests + 1;
  bVar1 = true;
  iVar4 = 0;
  while (bVar1) {
    pxVar44 = (htmlDocPtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar3 = (int)pxVar44;
      if (iVar3 == 5) break;
      iVar9 = xmlMemBlocks();
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar3,iVar2);
      htmlElementAllowedHere();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar9 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlElementAllowedHere",(ulong)(uint)(iVar2 - iVar9));
        iVar4 = iVar4 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar44;
      }
      pxVar44 = (htmlDocPtr)(ulong)(iVar3 + 1);
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  bVar1 = true;
LAB_00118750:
  if (bVar1) {
    bVar1 = true;
    while (bVar1) {
      iVar3 = xmlMemBlocks();
      bVar1 = false;
      in_RSI = (int *)0x0;
      htmlElementStatusHere(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar3 == iVar9) goto LAB_00118750;
      xmlMemBlocks();
      bVar1 = false;
      printf("Leak of %d blocks found in htmlElementStatusHere");
      iVar2 = iVar2 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
    goto LAB_00118750;
  }
  function_tests = function_tests + 1;
  bVar1 = true;
  local_8c = 0;
  while (bVar1) {
    for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
      pxVar44 = (htmlDocPtr)0x0;
      if (iVar3 == 0) {
        pxVar44 = (htmlDocPtr)(inttab + 1);
      }
      pxVar32 = (htmlDocPtr)0x1;
      while (pxVar32 != (htmlDocPtr)0x0) {
        uVar38 = 0;
        while( true ) {
          pxVar32 = (htmlDocPtr)0x0;
          iVar9 = (int)uVar38;
          if (iVar9 == 2) break;
          uVar35 = 0;
          if (iVar9 == 0) {
            uVar35 = 0x15e43c;
          }
          while( true ) {
            iVar11 = (int)in_RSI;
            iVar10 = (int)pxVar32;
            if (iVar10 == 4) break;
            iVar12 = xmlMemBlocks();
            iVar11 = gen_int(iVar10,iVar11);
            in_RSI = (int *)pxVar44;
            htmlEncodeEntities(0,pxVar44,0,uVar35,iVar11);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar11 = xmlMemBlocks();
            if (iVar12 != iVar11) {
              iVar11 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar11 - iVar12))
              ;
              local_8c = local_8c + 1;
              printf(" %d",0);
              printf(" %d",iVar3);
              printf(" %d",0);
              printf(" %d",uVar38);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar32;
            }
            pxVar32 = (htmlDocPtr)(ulong)(iVar10 + 1);
          }
          uVar38 = (ulong)(iVar9 + 1);
        }
      }
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  for (uVar46 = 0; uVar46 != 5; uVar46 = uVar46 + 1) {
    iVar9 = xmlMemBlocks();
    pxVar34 = gen_const_xmlChar_ptr(uVar46,(int)in_RSI);
    htmlEntityLookup(pxVar34);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityLookup",(ulong)(uint)(iVar10 - iVar9));
      iVar3 = iVar3 + 1;
      in_RSI = (int *)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  puVar41 = &DAT_0014b074;
  iVar9 = 0;
  for (uVar46 = 0; uVar46 != 3; uVar46 = uVar46 + 1) {
    iVar10 = xmlMemBlocks();
    htmlEntityValueLookup(*puVar41);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityValueLookup",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      in_RSI = (int *)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    puVar41 = puVar41 + 1;
  }
  function_tests = function_tests + 1;
  iVar10 = 0;
  for (uVar46 = 0; uVar46 != 4; uVar46 = uVar46 + 1) {
    iVar11 = xmlMemBlocks();
    iVar12 = gen_int(uVar46,(int)in_RSI);
    htmlHandleOmittedElem(iVar12);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlHandleOmittedElem",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      in_RSI = (int *)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  htmlInitAutoClose();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  iVar13 = 0;
  if (iVar11 != iVar12) {
    iVar14 = xmlMemBlocks();
    in_RSI = (int *)(ulong)(uint)(iVar14 - iVar11);
    printf("Leak of %d blocks found in htmlInitAutoClose");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar14 = 0;
  for (; iVar13 != 3; iVar13 = iVar13 + 1) {
    bVar1 = true;
    while (iVar16 = (int)in_RSI, bVar1) {
      iVar15 = xmlMemBlocks();
      pxVar44 = gen_htmlDocPtr(iVar13,iVar16);
      in_RSI = (int *)0x0;
      htmlIsAutoClosed(pxVar44);
      call_tests = call_tests + 1;
      des_htmlDocPtr((int)pxVar44,(htmlDocPtr)in_RSI,nr_00);
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar15 == iVar16) break;
      iVar16 = xmlMemBlocks();
      bVar1 = false;
      printf("Leak of %d blocks found in htmlIsAutoClosed",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar13 = 0;
  for (uVar46 = 0; uVar46 != 5; uVar46 = uVar46 + 1) {
    iVar16 = xmlMemBlocks();
    pxVar34 = gen_const_xmlChar_ptr(uVar46,(int)in_RSI);
    htmlIsScriptAttribute(pxVar34);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar16 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsScriptAttribute",(ulong)(uint)(iVar15 - iVar16));
      iVar13 = iVar13 + 1;
      in_RSI = (int *)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
  }
  test_ret_2 = (int)(iVar11 != iVar12);
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  pxVar30 = (htmlParserCtxtPtr)htmlNewParserCtxt();
  desret_htmlParserCtxtPtr(pxVar30);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  if (iVar11 != iVar12) {
    iVar16 = xmlMemBlocks();
    in_RSI = (int *)(ulong)(uint)(iVar16 - iVar11);
    printf("Leak of %d blocks found in htmlNewParserCtxt");
    putchar(10);
  }
  function_tests = function_tests + 1;
  bVar1 = true;
  iVar16 = 0;
  while (bVar1) {
    for (uVar46 = 0; uVar46 != 3; uVar46 = uVar46 + 1) {
      iVar15 = xmlMemBlocks();
      in_RSI = &call_tests;
      if (uVar46 != 0) {
        if (uVar46 == 1) {
          in_RSI = (int *)0xffffffffffffffff;
        }
        else {
          in_RSI = (int *)0x0;
        }
      }
      pxVar30 = (htmlParserCtxtPtr)htmlNewSAXParserCtxt(0);
      desret_htmlParserCtxtPtr(pxVar30);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar15 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewSAXParserCtxt",(ulong)(uint)(iVar17 - iVar15));
        iVar16 = iVar16 + 1;
        printf(" %d",0);
        in_RSI = (int *)(ulong)uVar46;
        printf(" %d");
        putchar(10);
      }
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  bVar1 = true;
  test_ret_1 = 0;
  while (bVar1) {
    for (uVar46 = 0; iVar15 = (int)in_RSI, uVar46 != 4; uVar46 = uVar46 + 1) {
      iVar17 = xmlMemBlocks();
      uVar7 = gen_int(uVar46,iVar15);
      in_RSI = (int *)(ulong)uVar7;
      htmlNodeStatus();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar17 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNodeStatus",(ulong)(uint)(iVar15 - iVar17));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",0);
        in_RSI = (int *)(ulong)uVar46;
        printf(" %d");
        putchar(10);
      }
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  iVar15 = 0;
  pxVar44 = (htmlDocPtr)0x0;
  while (iVar17 = (int)pxVar44, iVar17 != 3) {
    iVar18 = xmlMemBlocks();
    pxVar30 = gen_htmlParserCtxtPtr(iVar17,(int)in_RSI);
    htmlParseCharRef();
    call_tests = call_tests + 1;
    if (pxVar30 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseCharRef",(ulong)(uint)(iVar19 - iVar18));
      iVar15 = iVar15 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = (int *)pxVar44;
    }
    pxVar44 = (htmlDocPtr)(ulong)(iVar17 + 1);
  }
  function_tests = function_tests + 1;
  iVar17 = 0;
  for (iVar18 = 0; iVar18 != 3; iVar18 = iVar18 + 1) {
    for (iVar19 = 0; iVar19 != 4; iVar19 = iVar19 + 1) {
      uVar38 = 0;
      while (iVar24 = (int)uVar38, iVar24 != 4) {
        for (uVar46 = 0; iVar22 = (int)in_RSI, uVar46 != 4; uVar46 = uVar46 + 1) {
          iVar20 = xmlMemBlocks();
          pxVar30 = gen_htmlParserCtxtPtr(iVar18,iVar22);
          if (iVar19 == 0) {
            bVar1 = false;
            in_RSI = (int *)0x14b296;
          }
          else if (iVar19 == 2) {
            bVar1 = false;
            in_RSI = (int *)"test/ent2";
          }
          else if (iVar19 == 1) {
            bVar1 = false;
            in_RSI = (int *)0x14b903;
          }
          else {
            bVar1 = true;
            in_RSI = (int *)0x0;
          }
          iVar21 = gen_int(iVar24,iVar22);
          iVar22 = gen_int(uVar46,iVar22);
          if ((!bVar1) && (iVar23 = xmlStrlen(in_RSI), iVar23 < iVar21)) {
            iVar21 = 0;
          }
          htmlParseChunk(pxVar30,in_RSI,iVar21,iVar22);
          if (pxVar30 == (htmlParserCtxtPtr)0x0) {
            call_tests = call_tests + 1;
          }
          else {
            xmlFreeDoc(pxVar30->myDoc);
            pxVar30->myDoc = (xmlDocPtr)0x0;
            call_tests = call_tests + 1;
            htmlFreeParserCtxt();
          }
          xmlResetLastError();
          iVar22 = xmlMemBlocks();
          if (iVar20 != iVar22) {
            iVar22 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar22 - iVar20));
            iVar17 = iVar17 + 1;
            printf(" %d",iVar18);
            printf(" %d",iVar19);
            printf(" %d",uVar38);
            in_RSI = (int *)(ulong)uVar46;
            printf(" %d");
            putchar(10);
          }
        }
        uVar38 = (ulong)(iVar24 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar18 = 0;
  for (uVar46 = 0; uVar46 != 5; uVar46 = uVar46 + 1) {
    pxVar44 = (htmlDocPtr)0x0;
    puVar39 = &DAT_0015bd68;
    while( true ) {
      iVar19 = (int)in_RSI;
      uVar7 = (uint)pxVar44;
      if (uVar7 == 4) break;
      iVar24 = xmlMemBlocks();
      pxVar34 = gen_const_xmlChar_ptr(uVar46,iVar19);
      if (uVar7 < 3) {
        in_RSI = (int *)*puVar39;
      }
      else {
        in_RSI = (int *)0x0;
      }
      pxVar32 = (htmlDocPtr)htmlParseDoc(pxVar34);
      desret_htmlDocPtr(pxVar32);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar19 = xmlMemBlocks();
      if (iVar24 != iVar19) {
        iVar19 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar19 - iVar24));
        iVar18 = iVar18 + 1;
        printf(" %d",(ulong)uVar46);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar44;
      }
      pxVar44 = (htmlDocPtr)(ulong)(uVar7 + 1);
      puVar39 = puVar39 + 1;
    }
  }
  function_tests = function_tests + 1;
  iVar19 = 0;
  for (uVar46 = 0; uVar46 != 3; uVar46 = uVar46 + 1) {
    iVar24 = xmlMemBlocks();
    pxVar30 = gen_htmlParserCtxtPtr(uVar46,(int)in_RSI);
    htmlParseDocument();
    if (pxVar30 == (htmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar30->myDoc);
      pxVar30->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar24 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseDocument",(ulong)(uint)(iVar22 - iVar24));
      iVar19 = iVar19 + 1;
      in_RSI = (int *)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar24 = 0;
  for (uVar46 = 0; uVar46 != 3; uVar46 = uVar46 + 1) {
    iVar22 = xmlMemBlocks();
    pxVar30 = gen_htmlParserCtxtPtr(uVar46,(int)in_RSI);
    htmlParseElement();
    call_tests = call_tests + 1;
    if (pxVar30 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar22 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseElement",(ulong)(uint)(iVar20 - iVar22));
      iVar24 = iVar24 + 1;
      in_RSI = (int *)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar22 = 0;
  for (iVar20 = 0; iVar20 != 3; iVar20 = iVar20 + 1) {
    bVar1 = true;
    while (iVar21 = (int)in_RSI, bVar1) {
      iVar23 = xmlMemBlocks();
      pxVar30 = gen_htmlParserCtxtPtr(iVar20,iVar21);
      in_RSI = (int *)0x0;
      htmlParseEntityRef();
      call_tests = call_tests + 1;
      if (pxVar30 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar21 = xmlMemBlocks();
      if (iVar23 == iVar21) break;
      iVar21 = xmlMemBlocks();
      bVar1 = false;
      printf("Leak of %d blocks found in htmlParseEntityRef",(ulong)(uint)(iVar21 - iVar23));
      iVar22 = iVar22 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar20 = 0;
LAB_00119340:
  if (iVar20 == 8) {
    function_tests = function_tests + 1;
    local_4c = 0;
    for (iVar20 = 0; iVar20 != 5; iVar20 = iVar20 + 1) {
      uVar38 = 0;
      while (uVar46 = (uint)uVar38, uVar46 != 4) {
        for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
          pxVar44 = (htmlDocPtr)0x0;
          while( true ) {
            iVar23 = (int)in_RSI;
            iVar21 = (int)pxVar44;
            if (iVar21 == 4) break;
            iVar25 = xmlMemBlocks();
            pxVar34 = gen_const_xmlChar_ptr(iVar20,iVar23);
            if (uVar46 < 3) {
              in_RSI = (int *)(&DAT_0015bd68)[uVar38];
            }
            else {
              in_RSI = (int *)0x0;
            }
            if (uVar7 < 3) {
              uVar35 = (&DAT_0015bd68)[uVar7];
            }
            else {
              uVar35 = 0;
            }
            iVar23 = gen_int(iVar21,iVar23);
            pxVar32 = (htmlDocPtr)htmlReadDoc(pxVar34,in_RSI,uVar35,iVar23);
            desret_htmlDocPtr(pxVar32);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar23 = xmlMemBlocks();
            if (iVar25 != iVar23) {
              iVar23 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar23 - iVar25));
              local_4c = local_4c + 1;
              printf(" %d",iVar20);
              printf(" %d",uVar38);
              printf(" %d",uVar7);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar44;
            }
            pxVar44 = (htmlDocPtr)(ulong)(iVar21 + 1);
          }
        }
        uVar38 = (ulong)(uVar46 + 1);
      }
    }
    function_tests = function_tests + 1;
    local_50 = 0;
    for (uVar46 = 0; uVar46 != 8; uVar46 = uVar46 + 1) {
      uVar38 = 0;
      while (uVar7 = (uint)uVar38, uVar7 != 4) {
        pxVar44 = (htmlDocPtr)0x0;
        while( true ) {
          iVar20 = (int)in_RSI;
          iVar21 = (int)pxVar44;
          if (iVar21 == 4) break;
          iVar23 = xmlMemBlocks();
          pcVar29 = gen_filepath(uVar46,iVar20);
          if (uVar7 < 3) {
            in_RSI = (int *)(&DAT_0015bd68)[uVar38];
          }
          else {
            in_RSI = (int *)0x0;
          }
          iVar20 = gen_int(iVar21,iVar20);
          pxVar32 = (htmlDocPtr)htmlReadFile(pcVar29,in_RSI,iVar20);
          desret_htmlDocPtr(pxVar32);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar20 = xmlMemBlocks();
          if (iVar23 != iVar20) {
            iVar20 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar20 - iVar23));
            local_50 = local_50 + 1;
            printf(" %d",(ulong)uVar46);
            printf(" %d",uVar38);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar44;
          }
          pxVar44 = (htmlDocPtr)(ulong)(iVar21 + 1);
        }
        uVar38 = (ulong)(uVar7 + 1);
      }
    }
    function_tests = function_tests + 1;
    iVar20 = 0;
    for (uVar46 = 0; uVar46 != 4; uVar46 = uVar46 + 1) {
      for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
        for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
          uVar38 = 0;
          while (uVar37 = (uint)uVar38, uVar37 != 4) {
            for (no = 0; iVar21 = (int)in_RSI, no != 4; no = no + 1) {
              iVar23 = xmlMemBlocks();
              if (uVar46 == 0) {
                bVar1 = false;
                pcVar29 = "foo";
              }
              else if (uVar46 == 2) {
                bVar1 = false;
                pcVar29 = "test/ent2";
              }
              else if (uVar46 == 1) {
                bVar1 = false;
                pcVar29 = "<foo/>";
              }
              else {
                bVar1 = true;
                pcVar29 = (char *)0x0;
              }
              uVar26 = gen_int(uVar7,iVar21);
              if (uVar8 < 3) {
                uVar35 = (&DAT_0015bd68)[uVar8];
              }
              else {
                uVar35 = 0;
              }
              if (uVar37 < 3) {
                uVar40 = (&DAT_0015bd68)[uVar38];
              }
              else {
                uVar40 = 0;
              }
              iVar21 = gen_int(no,iVar21);
              if ((!bVar1) && (iVar25 = xmlStrlen(pcVar29), iVar25 < (int)uVar26)) {
                uVar26 = 0;
              }
              in_RSI = (int *)(ulong)uVar26;
              pxVar44 = (htmlDocPtr)htmlReadMemory(pcVar29,in_RSI,uVar35,uVar40,iVar21);
              desret_htmlDocPtr(pxVar44);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar21 = xmlMemBlocks();
              if (iVar23 != iVar21) {
                iVar21 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar21 - iVar23));
                iVar20 = iVar20 + 1;
                printf(" %d",(ulong)uVar46);
                printf(" %d",(ulong)uVar7);
                printf(" %d",uVar8);
                printf(" %d",uVar38);
                in_RSI = (int *)(ulong)no;
                printf(" %d");
                putchar(10);
              }
            }
            uVar38 = (ulong)(uVar37 + 1);
          }
        }
      }
    }
    function_tests = function_tests + 1;
    iVar21 = 0;
    for (uVar46 = 0; uVar46 != 5; uVar46 = uVar46 + 1) {
      uVar38 = 0;
      while (uVar7 = (uint)uVar38, uVar7 != 4) {
        bVar1 = true;
        while (bVar1) {
          pxVar44 = (htmlDocPtr)0x0;
          while( true ) {
            iVar23 = (int)in_RSI;
            iVar25 = (int)pxVar44;
            if (iVar25 == 3) break;
            iVar27 = xmlMemBlocks();
            pxVar34 = gen_const_xmlChar_ptr(uVar46,iVar23);
            if (uVar7 < 3) {
              in_RSI = (int *)(&DAT_0015bd68)[uVar38];
            }
            else {
              in_RSI = (int *)0x0;
            }
            piVar36 = &call_tests;
            if (iVar25 != 0) {
              if (iVar25 == 1) {
                piVar36 = (int *)0xffffffffffffffff;
              }
              else {
                piVar36 = (int *)0x0;
              }
            }
            pxVar32 = (htmlDocPtr)htmlSAXParseDoc(pxVar34,in_RSI,0,piVar36);
            desret_htmlDocPtr(pxVar32);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar23 = xmlMemBlocks();
            if (iVar27 != iVar23) {
              iVar23 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseDoc",(ulong)(uint)(iVar23 - iVar27));
              iVar21 = iVar21 + 1;
              printf(" %d",(ulong)uVar46);
              printf(" %d",uVar38);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar44;
            }
            pxVar44 = (htmlDocPtr)(ulong)(iVar25 + 1);
          }
          bVar1 = false;
        }
        uVar38 = (ulong)(uVar7 + 1);
      }
    }
    function_tests = function_tests + 1;
    iVar23 = 0;
    for (uVar46 = 0; uVar46 != 8; uVar46 = uVar46 + 1) {
      uVar38 = 0;
      while (uVar7 = (uint)uVar38, uVar7 != 4) {
        bVar1 = true;
        while (bVar1) {
          pxVar44 = (htmlDocPtr)0x0;
          while( true ) {
            iVar25 = (int)in_RSI;
            iVar27 = (int)pxVar44;
            if (iVar27 == 3) break;
            iVar28 = xmlMemBlocks();
            pcVar29 = gen_filepath(uVar46,iVar25);
            if (uVar7 < 3) {
              in_RSI = (int *)(&DAT_0015bd68)[uVar38];
            }
            else {
              in_RSI = (int *)0x0;
            }
            piVar36 = &call_tests;
            if (iVar27 != 0) {
              if (iVar27 == 1) {
                piVar36 = (int *)0xffffffffffffffff;
              }
              else {
                piVar36 = (int *)0x0;
              }
            }
            pxVar32 = (htmlDocPtr)htmlSAXParseFile(pcVar29,in_RSI,0,piVar36);
            desret_htmlDocPtr(pxVar32);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar25 = xmlMemBlocks();
            if (iVar28 != iVar25) {
              iVar25 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar25 - iVar28));
              iVar23 = iVar23 + 1;
              printf(" %d",(ulong)uVar46);
              printf(" %d",uVar38);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar44;
            }
            pxVar44 = (htmlDocPtr)(ulong)(iVar27 + 1);
          }
          bVar1 = false;
        }
        uVar38 = (ulong)(uVar7 + 1);
      }
    }
    function_tests = function_tests + 1;
    uVar46 = local_8c + iVar3 + iVar42 + iVar5 + iVar6 + iVar43 + iVar4 + iVar2 + iVar9 + iVar10 +
             test_ret_2 + iVar14 + iVar13 + (uint)(iVar11 != iVar12) + iVar16 + test_ret_1 + iVar15
             + iVar17 + iVar18 + iVar19 + iVar24 + iVar22 + local_4c + local_50 + iVar20 + iVar21 +
             iVar23;
    if (uVar46 != 0) {
      printf("Module HTMLparser: %d errors\n",(ulong)uVar46);
    }
    return uVar46;
  }
  pcVar29 = gen_filepath(iVar20,(int)in_RSI);
  iVar21 = 0;
  do {
    pcVar31 = "foo";
    switch(iVar21) {
    case 0:
      break;
    case 1:
      pcVar31 = "<foo/>";
      break;
    case 2:
      pcVar31 = "test/ent2";
      break;
    default:
      pcVar31 = (char *)0x0;
      break;
    case 4:
      goto switchD_00119365_caseD_4;
    }
    pxVar44 = (htmlDocPtr)htmlParseFile(pcVar29,pcVar31);
    desret_htmlDocPtr(pxVar44);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = iVar21 + 1;
  } while( true );
switchD_00119365_caseD_4:
  iVar20 = iVar20 + 1;
  in_RSI = (int *)(htmlDocPtr)0x14b296;
  goto LAB_00119340;
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 37 of 43 functions ...\n");
    test_ret += test_UTF8ToHtml();
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateFileParserCtxt();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtParseDocument();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtSetOptions();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlInitAutoClose();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNewSAXParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}